

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O1

bool FilesAreDifferent(path *a,path *b)

{
  _func_int *p_Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  string l2;
  string l1;
  ifstream as;
  ifstream bs;
  undefined1 auStack_488 [8];
  undefined1 *local_480;
  size_t local_478;
  undefined1 local_470 [16];
  undefined1 *local_460;
  size_t local_458;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  uint auStack_420 [56];
  undefined8 local_340 [33];
  undefined1 local_238 [32];
  byte abStack_218 [224];
  undefined8 local_138 [33];
  
  lVar5 = boost::filesystem::detail::file_size(a,(error_code *)0x0);
  lVar6 = boost::filesystem::detail::file_size(b,(error_code *)0x0);
  bVar7 = true;
  if (lVar5 == lVar6) {
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_440,a);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_238,b);
    local_458 = 0;
    local_450[0] = 0;
    local_478 = 0;
    local_470[0] = 0;
    p_Var1 = *(_func_int **)(local_440._0_8_ + -0x18);
    uVar3 = *(uint *)((long)auStack_420 + (long)p_Var1);
    local_480 = local_470;
    local_460 = local_450;
    if ((uVar3 == 0) &&
       (*(int *)(abStack_218 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) == 0)) {
      bVar7 = true;
      do {
        cVar2 = std::ios::widen((char)(auStack_488 + (long)p_Var1) + 'H');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_440,(string *)&local_460,cVar2);
        cVar2 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                                (char)(istream *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_480,cVar2);
        if ((local_458 != local_478) ||
           ((local_458 != 0 && (iVar4 = bcmp(local_460,local_480,local_458), iVar4 != 0))))
        goto LAB_001226cf;
        p_Var1 = *(_func_int **)(local_440._0_8_ + -0x18);
        uVar3 = *(uint *)((long)auStack_420 + (long)p_Var1);
      } while ((uVar3 == 0) &&
              (*(int *)(abStack_218 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) == 0));
    }
    bVar7 = true;
    if ((uVar3 & 2) != 0) {
      bVar7 = (abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 2) == 0;
    }
LAB_001226cf:
    if (local_480 != local_470) {
      operator_delete(local_480);
    }
    if (local_460 != local_450) {
      operator_delete(local_460);
    }
    local_238._0_8_ =
         std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_138[0] = 0x137b70;
    std::filebuf::~filebuf((filebuf *)(local_238 + 0x10));
    local_238._0_8_ =
         std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_138[0] = 0x137bc0;
    local_238._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_138);
    local_440._0_8_ =
         std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_340[0] = 0x137b70;
    std::filebuf::~filebuf((filebuf *)(local_440 + 0x10));
    local_440._0_8_ =
         std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_340[0] = 0x137bc0;
    local_440._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_340);
  }
  return bVar7;
}

Assistant:

static bool FilesAreDifferent(const filesystem::path &a, const filesystem::path &b) {
    if (filesystem::file_size(a) != filesystem::file_size(b)) {
        return true;
    }
    streams::ifstream as(a), bs(b);
    std::string l1, l2;
    while (as.good() && bs.good()) {
        getline(as, l1);
        getline(bs, l2);
        if (l1 != l2) {
            return true;
        }
    }
    return !(as.eof() && bs.eof());
}